

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

bool parse_instruction(context *ctx,opcode *op)

{
  pointer pp_Var1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  token_predicate tVar13;
  byte bVar14;
  char *pcVar15;
  token_type tVar16;
  int __sig;
  uint uVar17;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var18;
  long lVar19;
  token_predicate tVar20;
  operand *operand;
  char *string;
  pointer pp_Var21;
  bool bVar22;
  token token_1;
  token token;
  opcode saved_op;
  context saved_context;
  undefined1 local_220 [24];
  char *local_208;
  char *pcStack_200;
  int local_1f8;
  uint local_1e8;
  uint local_1e4;
  uint local_1e0;
  int local_1dc;
  undefined1 local_1d8 [24];
  char *pcStack_1c0;
  int local_1b8;
  token_predicate local_1b0;
  opcode *local_1a8;
  uint local_19c;
  uint local_198;
  token_type local_194;
  token_predicate local_190;
  undefined1 local_188 [32];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_168;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_148;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_138;
  undefined1 local_118 [24];
  char *pcStack_100;
  int local_f8;
  int iStack_f4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  _Optional_payload_base<context::program_type> local_b8;
  bool local_b0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  int local_80;
  int iStack_7c;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_78;
  undefined8 local_50 [4];
  
  context::tokenize((token *)local_188,ctx);
  uVar8 = local_188._24_4_;
  if (local_188._24_4_ == none) {
LAB_0011ec9d:
    return local_188._24_4_ != none;
  }
  tVar16 = local_188._24_4_;
  if (local_188._24_4_ == identifier) {
    do {
      if (*(char *)local_188._16_8_ != '.') {
        tVar16 = identifier;
        break;
      }
      context::parse_option(ctx,(token *)local_188);
      tVar16 = local_188._24_4_;
    } while (local_188._24_4_ == identifier);
  }
  if ((ctx->pc & 0x1fU) == 0) {
    ctx->pc = ctx->pc | 8;
  }
  if (tVar16 == at) {
    context::tokenize((token *)local_118,ctx);
    local_168._0_4_ = local_f8;
    local_188._8_4_ = local_118._8_4_;
    local_188._12_4_ = local_118._12_4_;
    local_188._16_8_ = local_118._16_8_;
    local_188._24_8_ = pcStack_100;
    tVar16 = (token_type)local_188;
    confirm_type((token *)local_118,tVar16);
    if (CONCAT44(local_118._4_4_,local_118._0_4_) != 0) {
      error::raise((error *)local_118,tVar16);
    }
    uVar12 = ((ulong)(local_188._12_4_ != 0) << 3 | (long)(int)local_188._8_4_) << 0x10;
    if ((uVar12 & op->value) == 0) {
      op->value = uVar12 | op->value;
      context::tokenize((token *)local_118,ctx);
      local_168._0_4_ = local_f8;
      local_188._16_8_ = local_118._16_8_;
      local_188._24_8_ = pcStack_100;
      uVar3 = local_188._24_8_;
      local_188._12_4_ = local_118._12_4_;
      local_188._8_4_ = local_118._8_4_;
      local_188._24_4_ = SUB84(pcStack_100,0);
      tVar16 = local_188._24_4_;
      local_188._24_8_ = uVar3;
LAB_0011e52f:
      local_194 = uVar8;
      if (tVar16 != identifier) {
        fatal_error((token *)local_188,"expected mnemonic");
      }
      context::context((context *)local_118,ctx);
      local_138._16_8_ = op->value;
      local_138._24_4_ = op->reuse;
      local_138._28_4_ = op->sched;
      local_1b0.index = 0;
      local_1b0.negated = 0;
      local_168._M_value._M_string_length = (size_type)&ctx->labels;
      local_138._M_value._M_string_length = (size_type)&ctx->type;
      local_138._M_value._M_dataplus._M_p = (_Alloc_hider)&ctx->entrypoint;
      local_148 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ctx->second_entrypoint;
      local_140 = &_Stack_78;
      local_168._16_8_ = &ctx->second_num_gprs;
      local_168._24_8_ = local_50;
      local_1dc = -1;
      lVar19 = 0;
      local_1a8 = op;
LAB_0011e5d7:
      string = table[lVar19].mnemonic;
      pcVar15 = string;
      iVar9 = equal((token *)local_188,string);
      __sig = (int)pcVar15;
      iVar10 = local_1dc;
      if (iVar9 == 0) goto LAB_0011ebbc;
      if ((op->value & table[lVar19].opcode) == 0) {
        op->value = op->value | table[lVar19].opcode;
        tVar13 = (token_predicate)context::tokenize((token *)(local_220 + 8),ctx);
        if (((table[lVar19].flags & 1) == 0) ||
           (tVar13.index = ~(uint)op->value, tVar13.negated = 0, (tVar13.index & 0x70000) == 0)) {
          pp_Var1 = table[lVar19].operands.
                    super__Vector_base<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          iVar9 = 0x3e9;
          for (pp_Var21 = table[lVar19].operands.
                          super__Vector_base<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start; pp_Var21 != pp_Var1;
              pp_Var21 = pp_Var21 + 1) {
            tVar13 = (token_predicate)
                     (**pp_Var21)((context *)local_1d8,(token *)ctx,(opcode *)(local_220 + 8));
            if ((token_predicate)local_1d8._0_8_ != (token_predicate)0x0) {
              iVar9 = iVar9 + -1000;
              tVar20 = (token_predicate)local_1d8._0_8_;
              goto LAB_0011eab8;
            }
            iVar9 = iVar9 + 1;
            op = local_1a8;
          }
          uVar17 = 0x7e0;
          if ((int)pcStack_200 == 0xc) {
            local_1e8 = 0;
            local_1e4 = 0;
            local_1e0 = 0;
            bVar7 = false;
            bVar6 = false;
            local_190 = tVar13;
LAB_0011e6cd:
            context::tokenize((token *)local_1d8,ctx);
            local_1f8 = local_1b8;
            local_208 = (char *)local_1d8._16_8_;
            pcStack_200 = pcStack_1c0;
            local_220._8_8_ = local_1d8._0_8_;
            local_220._16_8_ = local_1d8._8_8_;
            iVar10 = equal((token *)(local_220 + 8),"WAIT");
            if (iVar10 == 0) {
              iVar10 = equal((token *)(local_220 + 8),"WB");
              if ((iVar10 != 0) || (iVar10 = equal((token *)(local_220 + 8),"RB"), iVar10 != 0)) {
                iVar10 = equal((token *)(local_220 + 8),"WB");
                bVar22 = bVar7;
                if (iVar10 == 0) {
                  bVar22 = bVar6;
                }
                if (!bVar22) {
                  context::tokenize((token *)local_1d8,ctx);
                  local_1f8 = local_1b8;
                  local_208 = (char *)local_1d8._16_8_;
                  pcStack_200 = pcStack_1c0;
                  local_220._8_8_ = local_1d8._0_8_;
                  local_220._16_8_ = local_1d8._8_8_;
                  confirm_type((token *)local_220,(int)local_220 + tilde);
                  uVar3 = local_220._16_8_;
                  tVar20 = (token_predicate)local_220._0_8_;
                  if ((token_predicate)local_220._0_8_ == (token_predicate)0x0) {
                    if ((ulong)local_220._16_8_ < 6) {
                      context::tokenize((token *)local_1d8,ctx);
                      if (iVar10 != 0) {
                        bVar7 = true;
                      }
                      uVar17 = (uint)uVar3;
                      if (iVar10 == 0) {
                        bVar6 = true;
                        uVar17 = local_19c;
                        local_198 = (uint)uVar3;
                      }
                      goto LAB_0011e8cf;
                    }
                    pcVar15 = "barrier index must be between 0 and 5 inclusively";
                    goto LAB_0011ec1d;
                  }
                  goto LAB_0011eab8;
                }
                pcVar15 = "write";
                if (iVar10 == 0) {
                  pcVar15 = "read";
                }
                fail((token *)local_220,local_220 + 8,"%s barrier already specified",pcVar15);
LAB_0011ec2e:
                tVar20 = (token_predicate)local_220._0_8_;
                if ((token_predicate)local_220._0_8_ == (token_predicate)0x0) goto LAB_0011ea96;
                goto LAB_0011eab8;
              }
              iVar10 = equal((token *)(local_220 + 8),"Y");
              if ((iVar10 != 0) || (iVar10 = equal((token *)(local_220 + 8),"YIELD"), iVar10 != 0))
              {
                if ((local_1e4 & 1) != 0) {
                  pcVar15 = "yield already specified";
                  goto LAB_0011ec1d;
                }
                context::tokenize((token *)local_1d8,ctx);
                local_1e4 = (uint)CONCAT71((uint7)(uint3)((uint)local_1b8 >> 8),1);
                uVar17 = local_19c;
LAB_0011e8cf:
                local_19c = uVar17;
                pcStack_200._0_4_ = (int)pcStack_1c0;
                bVar22 = (int)pcStack_200 != 0xc;
                local_220._8_8_ = local_1d8._0_8_;
                local_220._16_8_ = local_1d8._8_8_;
                local_208 = (char *)local_1d8._16_8_;
                pcStack_200 = pcStack_1c0;
                local_1f8 = local_1b8;
                if (bVar22) goto LAB_0011ea20;
                goto LAB_0011e6cd;
              }
              iVar10 = equal((token *)(local_220 + 8),"DEP");
              if (iVar10 == 0) {
                pcVar15 = "expected @WAIT, @WB, @RB, @DEP, or @YIELD/@Y";
              }
              else {
                context::tokenize((token *)local_1d8,ctx);
                local_1f8 = local_1b8;
                local_208 = (char *)local_1d8._16_8_;
                pcStack_200 = pcStack_1c0;
                local_220._8_8_ = local_1d8._0_8_;
                local_220._16_8_ = local_1d8._8_8_;
                confirm_type((token *)local_220,(int)local_220 + tilde);
                tVar20 = (token_predicate)local_220._0_8_;
                if ((token_predicate)local_220._0_8_ != (token_predicate)0x0) goto LAB_0011eab8;
                if ((ulong)local_220._16_8_ < 6) {
                  bVar14 = (byte)local_220._16_8_;
                  if ((local_1e8 >> ((uint)local_220._16_8_ & 0x1f) & 1) != 0) {
                    fail((token *)local_220,local_220 + 8,
                         "dependency barrier index %d already specified");
                    goto LAB_0011ec2e;
                  }
                  context::tokenize((token *)local_1d8,ctx);
                  local_1e8 = local_1e8 | 1 << (bVar14 & 0x1f);
                  uVar17 = local_19c;
                  goto LAB_0011e8cf;
                }
                pcVar15 = "dependency barrier index must be between 0 and 5 inclusively";
              }
            }
            else {
              if ((local_1e0 & 1) != 0) {
                pcVar15 = "clocks to stall are already specified";
                goto LAB_0011ec1d;
              }
              context::tokenize((token *)local_1d8,ctx);
              local_1f8 = local_1b8;
              local_208 = (char *)local_1d8._16_8_;
              pcStack_200 = pcStack_1c0;
              local_220._8_8_ = local_1d8._0_8_;
              local_220._16_8_ = local_1d8._8_8_;
              confirm_type((token *)local_220,(int)local_220 + tilde);
              tVar20 = (token_predicate)local_220._0_8_;
              if ((token_predicate)local_220._0_8_ != (token_predicate)0x0) goto LAB_0011eab8;
              local_190.index = local_220._16_4_;
              local_190.negated = local_220._20_4_;
              if ((ulong)local_220._16_8_ < 0x10) {
                context::tokenize((token *)local_1d8,ctx);
                local_1e0 = (uint)CONCAT71((uint7)(uint3)((uint)local_1b8 >> 8),1);
                uVar17 = local_19c;
                goto LAB_0011e8cf;
              }
              pcVar15 = "number of waited clocks must be between 0 and 15 inclusively";
            }
LAB_0011ec1d:
            fail((token *)local_220,local_220 + 8,pcVar15);
            goto LAB_0011ec2e;
          }
          goto LAB_0011ea92;
        }
        fail((token *)local_1d8,local_220 + 8,"%s does not support predicated execution",string);
        iVar9 = 0;
        goto LAB_0011eaaf;
      }
    }
  }
  else if ((op->value & 0x70000) == 0) {
    op->value = op->value | 0x70000;
    goto LAB_0011e52f;
  }
  __assert_fail("(value & bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                ,0x31,"void opcode::add_bits(uint64_t)");
LAB_0011ea20:
  uVar17 = local_190.index & 0xf;
  if ((local_1e0 & 1) == 0) {
    uVar17 = 0;
  }
  uVar11 = (local_19c & 7) << 5;
  if (!bVar7) {
    uVar11 = 0xe0;
  }
  uVar2 = (local_198 & 7) << 8;
  if (!bVar6) {
    uVar2 = 0x700;
  }
  uVar17 = uVar2 | uVar11 | uVar17 | (uint)(byte)(((byte)local_1e4 & 1) << 4) |
           (local_1e8 & 0x3f) << 0xb;
  op = local_1a8;
LAB_0011ea92:
  (op->sched).raw = uVar17;
LAB_0011ea96:
  confirm_type((token *)local_1d8,(int)local_220 + tilde);
LAB_0011eaaf:
  tVar20 = (token_predicate)local_1d8._0_8_;
  if ((token_predicate)local_1d8._0_8_ == (token_predicate)0x0) {
    ctx->pc = ctx->pc + 8;
    if (local_1b0 != (token_predicate)0x0) {
      operator_delete__((void *)local_1b0);
    }
    context::~context((context *)local_118);
    local_188._24_4_ = local_194;
    goto LAB_0011ec9d;
  }
LAB_0011eab8:
  iVar10 = local_1dc;
  if (local_1dc < iVar9) {
    if (local_1b0 != (token_predicate)0x0) {
      operator_delete__((void *)local_1b0);
      local_1b0 = tVar20;
      tVar20 = local_1b0;
    }
    local_1b0 = tVar20;
    tVar20.index = 0;
    tVar20.negated = 0;
    iVar10 = iVar9;
  }
  ctx->line = local_f8;
  ctx->column = iStack_f4;
  ctx->text_begin = (char *)local_118._16_8_;
  ctx->text = pcStack_100;
  ctx->pc = CONCAT44(local_118._4_4_,local_118._0_4_);
  ctx->filename = (char *)CONCAT44(local_118._12_4_,local_118._8_4_);
  if ((context *)local_118 != ctx) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_168._M_value._M_string_length,&local_f0);
  }
  *(bool *)&((_Optional_payload_base<context::program_type> *)
            (local_138._M_value._M_string_length + 8))->_M_payload = local_b0;
  *(_Optional_payload_base<context::program_type> *)local_138._M_value._M_string_length = local_b8;
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_138._M_value._M_dataplus._M_p,&local_a8);
  ctx->num_gprs = local_80;
  ctx->local_mem_size = iStack_7c;
  p_Var18 = local_140;
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_copy_assign(local_148,local_140);
  __sig = (int)p_Var18;
  uVar3 = *(undefined8 *)local_168._24_8_;
  uVar4 = *(undefined8 *)(local_168._24_8_ + 8);
  uVar5 = *(undefined8 *)(local_168._24_8_ + 0x14);
  *(undefined8 *)(local_168._16_8_ + 0xc) = *(undefined8 *)(local_168._24_8_ + 0xc);
  *(undefined8 *)(local_168._16_8_ + 0x14) = uVar5;
  *(undefined8 *)local_168._16_8_ = uVar3;
  *(undefined8 *)((array<unsigned_int,_3UL> *)(local_168._16_8_ + 8))->_M_elems = uVar4;
  local_1a8->value = local_138._16_8_;
  local_1a8->reuse = local_138._24_4_;
  local_1a8->sched = (anon_union_4_2_f99a8bb9_for_sched)local_138._28_4_;
  op = local_1a8;
  if (tVar20 != (token_predicate)0x0) {
    operator_delete__((void *)tVar20);
    op = local_1a8;
  }
LAB_0011ebbc:
  lVar19 = lVar19 + 1;
  local_1dc = iVar10;
  if (lVar19 == 0x109) {
    if (local_1b0 == (token_predicate)0x0) {
      fatal_error((token *)local_188,"unknown mnemonic \x1b[1m%.*s\x1b[0m",local_188._8_8_,
                  local_188._16_8_);
    }
    error::raise((error *)&local_1b0,__sig);
  }
  goto LAB_0011e5d7;
}

Assistant:

bool parse_instruction(context& ctx, opcode& op)
{
    token token = ctx.tokenize();
    if (token.type == token_type::none) {
        return false;
    }
    while (token.type == token_type::identifier && token.data.string[0] == '.') {
        ctx.parse_option(token);
    }
    if (ctx.pc % 0x20 == 0) {
        ctx.pc += 8;
    }
    if (token.type == token_type::at) {
        token = ctx.tokenize();
        if (error message = assemble_predicate(token, op, 16, 1); message) {
            message.raise();
        }
        token = ctx.tokenize();
    } else {
        // write always execute by default
        op.add_bits(7ULL << 16);
    }
    if (token.type != token_type::identifier) {
        fatal_error(token, "expected mnemonic");
    }
    const context saved_context = ctx;
    const opcode saved_op = op;
    error error_message;
    int error_score = -1;

    const size_t num_insns = sizeof(table) / sizeof(table[0]);
    for (size_t i = 0; i < num_insns; ++i) {
        const insn& insn = table[i];
        if (!equal(token, insn.mnemonic)) {
            continue;
        }
        auto [insn_error, score] = parse_insn(ctx, op, insn);
        if (!insn_error) {
            // successfully decoded instruction
            ctx.pc += 8;
            return true;
        }
        if (score > error_score) {
            error_message = std::move(insn_error);
            error_score = score;
        }
        // failure, restore context
        ctx = saved_context;
        op = saved_op;
    }
    if (error_message) {
        error_message.raise();
    } else {
        fatal_error(token, "unknown mnemonic \33[1m%.*s\33[0m", std::size(token.data.string),
                    std::data(token.data.string));
    }
}